

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O3

int speex_resampler_process_native
              (SpeexResamplerState *st,uint channel_index,uint *in_len,spx_word16_t *out,
              uint *out_len)

{
  uint uVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  spx_word16_t *psVar6;
  
  uVar1 = st->filt_len;
  psVar6 = st->mem + st->mem_alloc_size * channel_index;
  st->started = 1;
  uVar3 = (*st->resampler_ptr)(st,channel_index,psVar6,in_len,out,out_len);
  piVar2 = st->last_sample;
  uVar4 = piVar2[channel_index];
  if ((int)uVar4 < (int)*in_len) {
    *in_len = uVar4;
  }
  *out_len = uVar3;
  uVar4 = *in_len;
  piVar2 = piVar2 + channel_index;
  *piVar2 = *piVar2 - uVar4;
  if (1 < (int)uVar1) {
    uVar4 = *in_len;
    uVar5 = 0;
    do {
      psVar6[uVar5] = psVar6[uVar4 + (int)uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar1 - 1 != uVar5);
  }
  return uVar4;
}

Assistant:

static int speex_resampler_process_native(SpeexResamplerState *st, spx_uint32_t channel_index, spx_uint32_t *in_len, spx_word16_t *out, spx_uint32_t *out_len)
{
   int j=0;
   const int N = st->filt_len;
   int out_sample = 0;
   spx_word16_t *mem = st->mem + channel_index * st->mem_alloc_size;
   spx_uint32_t ilen;

   st->started = 1;

   /* Call the right resampler through the function ptr */
   out_sample = st->resampler_ptr(st, channel_index, mem, in_len, out, out_len);

   if (st->last_sample[channel_index] < (spx_int32_t)*in_len)
      *in_len = st->last_sample[channel_index];
   *out_len = out_sample;
   st->last_sample[channel_index] -= *in_len;

   ilen = *in_len;

   for(j=0;j<N-1;++j)
     mem[j] = mem[j+ilen];

   return RESAMPLER_ERR_SUCCESS;
}